

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O1

string * __thiscall
Assimp::(anonymous_namespace)::GetMaterialName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,aiMaterial *mat,uint index)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  aiReturn aVar4;
  int iVar5;
  long *plVar6;
  uint uVar7;
  size_type *psVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  char *pcVar13;
  char postfix [10];
  aiString mat_name;
  char local_450 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  aiString local_41c;
  
  uVar11 = (ulong)mat & 0xffffffff;
  if ((GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::underscore_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(), iVar5 != 0)) {
    GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::underscore_abi_cxx11_._M_dataplus.
    _M_p = (pointer)&GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::
                     underscore_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::underscore_abi_cxx11_,
               "_","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::underscore_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release();
  }
  local_450[8] = '\0';
  local_450[9] = '\0';
  local_450[0] = '\0';
  local_450[1] = '\0';
  local_450[2] = '\0';
  local_450[3] = '\0';
  local_450[4] = '\0';
  local_450[5] = '\0';
  local_450[6] = '\0';
  local_450[7] = '\0';
  if ((int)mat < 0) {
    pcVar13 = local_450 + 1;
    local_450[0] = '-';
    local_450[1] = '\0';
    local_450[2] = '\0';
    local_450[3] = '\0';
    local_450[4] = '\0';
    local_450[5] = '\0';
    local_450[6] = '\0';
    local_450[7] = '\0';
    uVar11 = (ulong)(uint)-(int)mat;
    uVar7 = 2;
  }
  else {
    pcVar13 = local_450;
    uVar7 = 1;
  }
  iVar5 = 1000000000;
  bVar12 = false;
  do {
    uVar10 = (uint)uVar11;
    if (9 < uVar7) break;
    uVar9 = (int)uVar10 % iVar5;
    if (((bVar12) || (iVar5 == 1)) || ((int)((long)(int)uVar10 / (long)iVar5) != 0)) {
      pcVar1 = pcVar13 + 1;
      uVar7 = uVar7 + 1;
      *pcVar13 = (char)((long)(int)uVar10 / (long)iVar5) + '0';
      bVar12 = true;
      pcVar13 = pcVar1;
      uVar10 = uVar9;
      if (iVar5 != 1) goto LAB_0068b4f1;
      bVar3 = false;
      iVar5 = 1;
    }
    else {
LAB_0068b4f1:
      uVar9 = uVar10;
      iVar5 = iVar5 / 10;
      bVar3 = true;
    }
    uVar11 = (ulong)uVar9;
  } while (bVar3);
  *pcVar13 = '\0';
  local_41c.length = 0;
  local_41c.data[0] = '\0';
  memset(local_41c.data + 1,0x1b,0x3ff);
  aVar4 = aiGetMaterialString((aiMaterial *)this,"?mat.name",0,0,&local_41c);
  if (aVar4 == aiReturn_SUCCESS) {
    std::operator+(&local_440,local_41c.data,
                   &GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::
                    underscore_abi_cxx11_);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_440);
  }
  else {
    std::operator+(&local_440,"Material",
                   &GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::
                    underscore_abi_cxx11_);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_440);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar8) {
    lVar2 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetMaterialName(const aiMaterial& mat, unsigned int index) {
        static const std::string underscore = "_";
        char postfix[10] = {0};
        ASSIMP_itoa10(postfix, index);

        aiString mat_name;
        if (AI_SUCCESS == mat.Get(AI_MATKEY_NAME, mat_name)) {
            return mat_name.C_Str() + underscore + postfix;
        }

        return "Material" + underscore + postfix;
    }